

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O1

dlb * dlb_fopen(char *name,char *mode)

{
  boolean bVar1;
  dlb *dp;
  FILE *pFVar2;
  char *mode_00;
  
  if (dlb_initialized != '\0') {
    dp = (dlb *)malloc(0x28);
    bVar1 = lib_dlb_fopen(dp,name,mode_00);
    if (bVar1 != '\0') {
      dp->fp = (FILE *)0x0;
      return dp;
    }
    pFVar2 = fopen_datafile(name,mode,1);
    if (pFVar2 != (FILE *)0x0) {
      dp->fp = pFVar2;
      return dp;
    }
    free(dp);
  }
  return (dlb *)0x0;
}

Assistant:

dlb *dlb_fopen(const char *name, const char *mode)
{
    FILE *fp;
    dlb *dp;

    if (!dlb_initialized) return NULL;

    dp = malloc(sizeof(dlb));
    if (do_dlb_fopen(dp, name, mode))
    	dp->fp = NULL;
    else if ((fp = fopen_datafile(name, mode, DATAPREFIX)) != 0)
	dp->fp = fp;
    else {
	/* can't find anything */
	free(dp);
	dp = NULL;
	}

    return dp;
}